

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O0

string * __thiscall
slang::CommandLine::Option::set_abi_cxx11_
          (Option *this,optional<unsigned_int> *target,string_view name,string_view value)

{
  _Optional_base<unsigned_int,_true,_true> _Var1;
  _Optional_base<unsigned_int,_true,_true> *in_RDX;
  string *in_RDI;
  string *unaff_retaddr;
  undefined1 in_stack_00000008 [16];
  string_view in_stack_00000018;
  string *error;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  
  std::__cxx11::string::string(in_stack_ffffffffffffff90);
  _Var1._M_payload.super__Optional_payload_base<unsigned_int> =
       (_Optional_payload<unsigned_int,_true,_true,_true>)
       parseInt<unsigned_int>(in_stack_00000018,(string_view)in_stack_00000008,unaff_retaddr);
  in_RDX->_M_payload = _Var1._M_payload.super__Optional_payload_base<unsigned_int>;
  return in_RDI;
}

Assistant:

std::string CommandLine::Option::set(std::optional<uint32_t>& target, std::string_view name,
                                     std::string_view value) {
    std::string error;
    target = parseInt<uint32_t>(name, value, error);
    return error;
}